

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_set(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char arg [4608];
  char *in_stack_000023f8;
  CHAR_DATA *in_stack_00002400;
  char *in_stack_00002408;
  CHAR_DATA *in_stack_00002410;
  char *in_stack_00004a58;
  CHAR_DATA *in_stack_00004a60;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  undefined4 in_stack_ffffffffffffee00;
  int in_stack_ffffffffffffee04;
  char *in_stack_ffffffffffffee08;
  CHAR_DATA *in_stack_ffffffffffffee10;
  char *in_stack_ffffffffffffee18;
  char *in_stack_ffffffffffffffe8;
  
  log_naughty(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee04);
  ch_00 = (CHAR_DATA *)
          one_argument(in_stack_ffffffffffffedf0,
                       (char *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
  }
  else {
    bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
    if ((bVar1) &&
       (bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10), bVar1)) {
      bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      if (bVar1) {
        bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
        if ((bVar1) &&
           (bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10), bVar1))
        {
          bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
          if (bVar1) {
            bVar1 = str_prefix(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
            if (bVar1) {
              do_set(ch_00,in_stack_ffffffffffffffe8);
            }
            else {
              do_rset(in_stack_00002400,in_stack_000023f8);
            }
          }
          else {
            do_oset(in_stack_00002400,in_stack_000023f8);
          }
        }
        else {
          do_sset(in_stack_00002410,in_stack_00002408);
        }
      }
      else {
        do_sgset(in_stack_00002410,in_stack_00002408);
      }
    }
    else {
      do_mset(in_stack_00004a60,in_stack_00004a58);
    }
  }
  return;
}

Assistant:

void do_set(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	log_naughty(ch, argument, 2);
	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set mob    <name> <field> <value>\n\r", ch);
		send_to_char("  set obj    <name> <field> <value>\n\r", ch);
		send_to_char("  set room   <room> <field> <value>\n\r", ch);
		send_to_char("  set skill  <name> <spell or skill> <value>\n\r", ch);
		send_to_char("	set sgroup <name> <group name>\n\r", ch);
		send_to_char("  set form   <name> <form/all> <%>\n\r", ch);
		return;
	}

	if (!str_prefix(arg, "mobile") || !str_prefix(arg, "character"))
	{
		do_mset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "sgroup"))
	{
		do_sgset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "skill") || !str_prefix(arg, "spell"))
	{
		do_sset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "object"))
	{
		do_oset(ch, argument);
		return;
	}

	if (!str_prefix(arg, "room"))
	{
		do_rset(ch, argument);
		return;
	}

	/* echo syntax */
	do_set(ch, "");
}